

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<ninx::parser::element::FunctionCall,_std::default_delete<ninx::parser::element::FunctionCall>_>
 __thiscall ninx::parser::Parser::parse_operator_call(Parser *this,char limiter)

{
  TokenReader *this_00;
  pointer pcVar1;
  int iVar2;
  mapped_type *pmVar3;
  FunctionCallArgument *this_01;
  FunctionCall *this_02;
  long *plVar4;
  undefined8 *puVar5;
  undefined8 *extraout_RAX;
  undefined8 extraout_RAX_00;
  long *plVar6;
  size_type *psVar7;
  char in_DL;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  undefined7 in_register_00000031;
  Parser *this_03;
  __single_object argument;
  vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  arguments;
  mapped_type name;
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_> body;
  char local_b1;
  _Head_base<0UL,_ninx::parser::element::Expression_*,_false> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  _Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false> local_a0;
  vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  local_98;
  vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  local_70;
  long lStack_58;
  string local_50;
  _Alloc_hider local_30;
  
  this_03 = (Parser *)CONCAT71(in_register_00000031,limiter);
  this_00 = &this_03->reader;
  local_b1 = in_DL;
  iVar2 = TokenReader::check_limiter(this_00,in_DL);
  if (iVar2 == 1) {
    TokenReader::get_token(this_00);
    parse_implicit_block_until((Parser *)&stack0xffffffffffffffd0,limiter);
    iVar2 = TokenReader::check_limiter(this_00,local_b1);
    if (iVar2 == 1) {
      TokenReader::get_token(this_00);
      pmVar3 = std::__detail::
               _Map_base<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this_03->operators,&local_b1);
      pcVar1 = (pmVar3->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar1,pcVar1 + pmVar3->_M_string_length);
      local_98.
      super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.
      super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.
      super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 operator_new(0x20);
      (local_a8->_M_dataplus)._M_p = (pointer)&local_a8->field_2;
      *(undefined4 *)&local_a8->field_2 = 0x79646f62;
      local_a8->_M_string_length = 4;
      (local_a8->field_2)._M_local_buf[4] = '\0';
      this_01 = (FunctionCallArgument *)operator_new(0x28);
      local_b0._M_head_impl = (Expression *)local_30._M_p;
      local_70.
      super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_a8;
      local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_30._M_p = (pointer)0x0;
      element::FunctionCallArgument::FunctionCallArgument
                (this_01,(unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_70,
                 (unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                  *)&local_b0);
      local_a0._M_head_impl = this_01;
      if (local_b0._M_head_impl != (Expression *)0x0) {
        (*((local_b0._M_head_impl)->super_Statement).super_ASTElement._vptr_ASTElement[1])();
      }
      local_b0._M_head_impl = (Expression *)0x0;
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_70.
          super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_70.
                     super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a8,local_a8);
      }
      std::
      vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>,std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>>>
      ::
      emplace_back<std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>>
                ((vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>,std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>>>
                  *)&local_98,
                 (unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                  *)&local_a0);
      this_02 = (FunctionCall *)operator_new(0x60);
      local_70.
      super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_98.
           super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_70.
      super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_98.
           super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_70.
      super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_98.
           super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_98.
      super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.
      super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.
      super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b0._M_head_impl = (Expression *)0x0;
      element::FunctionCall::FunctionCall
                (this_02,&local_50,&local_70,
                 (unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                  *)&local_b0,false);
      (this->origin)._M_dataplus._M_p = (pointer)this_02;
      if (local_b0._M_head_impl != (Expression *)0x0) {
        (*((local_b0._M_head_impl)->super_Statement).super_ASTElement._vptr_ASTElement[1])();
      }
      local_b0._M_head_impl = (Expression *)0x0;
      std::
      vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
      ::~vector(&local_70);
      if (local_a0._M_head_impl != (FunctionCallArgument *)0x0) {
        (*((local_a0._M_head_impl)->super_ASTElement)._vptr_ASTElement[1])();
      }
      std::
      vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
      ::~vector(&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      return (__uniq_ptr_data<ninx::parser::element::FunctionCall,_std::default_delete<ninx::parser::element::FunctionCall>,_true,_true>
              )(__uniq_ptr_data<ninx::parser::element::FunctionCall,_std::default_delete<ninx::parser::element::FunctionCall>,_true,_true>
                )this;
    }
    local_98.
    super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&local_98.
                   super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct((ulong)&local_98,'\x01');
    puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x1cf1a7);
    local_70.
    super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)*puVar5;
    plVar4 = puVar5 + 2;
    if (local_70.
        super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)plVar4) {
      local_70.
      super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar4;
      lStack_58 = puVar5[3];
      local_70.
      super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&local_70.
                     super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      local_70.
      super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar4;
    }
    local_70.
    super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
    local_50._M_dataplus._M_p = (pointer)*puVar5;
    psVar7 = puVar5 + 2;
    if ((size_type *)local_50._M_dataplus._M_p == psVar7) {
      local_50.field_2._M_allocated_capacity = *psVar7;
      local_50.field_2._8_8_ = puVar5[3];
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      goto LAB_00148b60;
    }
  }
  else {
    local_98.
    super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&local_98.
                   super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct((ulong)&local_98,'\x01');
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x1cf178);
    local_70.
    super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar4;
    plVar6 = plVar4 + 2;
    if (local_70.
        super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)plVar6) {
      local_70.
      super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar6;
      lStack_58 = plVar4[3];
      local_70.
      super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&local_70.
                     super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      local_70.
      super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar6;
    }
    local_70.
    super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_50._M_dataplus._M_p = (pointer)*plVar4;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_50._M_dataplus._M_p == psVar7) {
      local_50.field_2._M_allocated_capacity = *psVar7;
      local_50.field_2._8_8_ = plVar4[3];
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    }
    else {
      local_50.field_2._M_allocated_capacity = *psVar7;
    }
    local_50._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    generate_exception(this_03,&local_50);
    puVar5 = extraout_RAX;
    local_50._M_dataplus._M_p = (pointer)extraout_RDX;
  }
  local_50.field_2._M_allocated_capacity = *psVar7;
LAB_00148b60:
  local_50._M_string_length = puVar5[1];
  *puVar5 = psVar7;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  generate_exception(this_03,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_70.
      super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&local_70.
                super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_70.
                    super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_70.
                                     super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t).
                                   super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                                   .
                                   super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>
                                   ._M_head_impl + 1));
  }
  if (local_98.
      super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&local_98.
                super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_98.
                    super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_98.
                                     super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t).
                                   super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                                   .
                                   super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>
                                   ._M_head_impl + 1));
  }
  if ((long *)local_30._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_30._M_p + 8))();
  }
  _Unwind_Resume(extraout_RAX_00);
}

Assistant:

std::unique_ptr<FunctionCall> ninx::parser::Parser::parse_operator_call(char limiter) {
    if (reader.check_limiter(limiter) != 1) {
        generate_exception("Expected operator '" + std::string(1, limiter) + "', but could not find one.");
    }
    reader.get_token();

    auto body {parse_implicit_block_until(limiter)};

    if (reader.check_limiter(limiter) != 1) {
        generate_exception("Expected closing operator '" + std::string(1, limiter) + "', but could not find one.");
    }
    reader.get_token();

    // Get the name of the function the operator refers to
    auto name {operators.at(limiter)};

    // Create the function call
    std::vector<std::unique_ptr<FunctionCallArgument>> arguments;
    auto argument = std::make_unique<FunctionCallArgument>(std::make_unique<std::string>("body"), std::move(body));
    arguments.push_back(std::move(argument));

    auto function_call = std::make_unique<FunctionCall>(name, std::move(arguments),
                                                        nullptr, false);

    return function_call;
}